

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::ZmpTrackingGainEstimator::ZmpTrackingGainEstimator
          (ZmpTrackingGainEstimator *this,double dt,Vector2 *zmpMeasureErrorStd,
          Vector3 *gainDriftPerSecond,Vector2 *zmpProcessErrorStd,double minimumGain,
          Vector2 *initZMP,Vector3 *initGain,Vector2 *initZMPUncertainty,
          Vector3 *initGainUncertainty)

{
  Cmatrix local_d0;
  Type local_b8;
  Type local_88;
  Vector3 *local_48;
  Vector3 *initGain_local;
  Vector2 *initZMP_local;
  double minimumGain_local;
  Vector2 *zmpProcessErrorStd_local;
  Vector3 *gainDriftPerSecond_local;
  Vector2 *zmpMeasureErrorStd_local;
  double dt_local;
  ZmpTrackingGainEstimator *this_local;
  
  this->dt_ = dt;
  this->minimumGain_ = minimumGain;
  local_48 = initGain;
  initGain_local = (Vector3 *)initZMP;
  initZMP_local = (Vector2 *)minimumGain;
  minimumGain_local = (double)zmpProcessErrorStd;
  zmpProcessErrorStd_local = (Vector2 *)gainDriftPerSecond;
  gainDriftPerSecond_local = (Vector3 *)zmpMeasureErrorStd;
  zmpMeasureErrorStd_local = (Vector2 *)dt;
  dt_local = (double)this;
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->zmpMeasureErrorstd_,zmpMeasureErrorStd);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&this->gainDriftPerSecondStd_,(Matrix<double,_3,_1,_0,_3,_1> *)zmpProcessErrorStd_local
            );
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
            (&this->zmpProcessErrorStd_,(Matrix<double,_2,_1,_0,_2,_1> *)minimumGain_local);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix(&this->yaw_);
  LinearKalmanFilter::LinearKalmanFilter(&this->filter_,5,2,0);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix(&this->A_);
  Eigen::Matrix<double,_2,_5,_0,_2,_5>::Matrix(&this->C_);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix(&this->R_);
  Eigen::Matrix<double,_5,_5,_0,_5,_5>::Matrix(&this->Q_);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix(&this->previousOrientation_);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&this->A_);
  Eigen::DenseBase<Eigen::Matrix<double,2,5,0,2,5>>::topLeftCorner<2,2>(&local_88,&this->C_);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false>_>::setIdentity
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false>_> *)
             &local_88);
  Eigen::DenseBase<Eigen::Matrix<double,2,5,0,2,5>>::bottomRightCorner<2,3>(&local_b8,&this->C_);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_3,_false>_>::setZero
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_3,_false>_> *)
             &local_b8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,5,0,2,5>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_d0,
             (EigenBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_> *)&this->C_);
  KalmanFilterBase::setC(&(this->filter_).super_KalmanFilterBase,&local_d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_d0);
  Eigen::DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)&this->Q_);
  resetWithMeasurements
            (this,(Vector2 *)initGain_local,local_48,0.0,initZMPUncertainty,initGainUncertainty);
  return;
}

Assistant:

ZmpTrackingGainEstimator::ZmpTrackingGainEstimator(double dt,
                                                   const Vector2 & zmpMeasureErrorStd,
                                                   const Vector3 & gainDriftPerSecond,
                                                   const Vector2 & zmpProcessErrorStd,
                                                   double minimumGain,
                                                   const Vector2 & initZMP,
                                                   const Vector3 & initGain,
                                                   const Vector2 & initZMPUncertainty,
                                                   const Vector3 & initGainUncertainty)
: dt_(dt), minimumGain_(minimumGain), zmpMeasureErrorstd_(zmpMeasureErrorStd),
  gainDriftPerSecondStd_(gainDriftPerSecond), zmpProcessErrorStd_(zmpProcessErrorStd), filter_(5, 2, 0)
{
  A_.setIdentity();
  C_.topLeftCorner<2, 2>().setIdentity();
  C_.bottomRightCorner<2, 3>().setZero();
  filter_.setC(C_);
  Q_.setZero();
  resetWithMeasurements(initZMP, initGain, 0., initZMPUncertainty, initGainUncertainty);
}